

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void __thiscall hwnet::TCPSocket::registerTimer(TCPSocket *this,int tt)

{
  bool bVar1;
  byte local_c1;
  byte local_b1;
  undefined1 local_a8 [32];
  shared_ptr<hwnet::TCPSocket> sp_1;
  shared_ptr<hwnet::util::Timer> local_78 [2];
  undefined1 local_58 [32];
  shared_ptr<hwnet::TCPSocket> sp;
  shared_ptr<hwnet::util::Timer> local_28;
  int local_14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  int tt_local;
  TCPSocket *this_local;
  
  local_14 = tt;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if (tt == 1) {
    bVar1 = linklist::empty(this->ptrSendlist);
    sp.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
    local_b1 = 0;
    if (!bVar1) {
      std::weak_ptr<hwnet::util::Timer>::lock((weak_ptr<hwnet::util::Timer> *)&local_28);
      sp.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
           1;
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_28);
      local_b1 = bVar1 ^ 0xff;
    }
    if ((sp.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
        & 1) != 0) {
      std::shared_ptr<hwnet::util::Timer>::~shared_ptr(&local_28);
    }
    if ((local_b1 & 1) != 0) {
      std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this
                ((enable_shared_from_this<hwnet::TCPSocket> *)(local_58 + 0x18));
      local_58._16_8_ = std::chrono::_V2::steady_clock::now();
      (this->lastSendTime).__d.__r = local_58._16_8_;
      Poller::
      addTimer<void(&)(std::shared_ptr<hwnet::util::Timer>const&,std::shared_ptr<hwnet::TCPSocket>),std::shared_ptr<hwnet::TCPSocket>&>
                ((Poller *)local_58,(milliseconds)this->poller_,
                 (_func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPSocket> *)
                 (long)timoutResolution,(shared_ptr<hwnet::TCPSocket> *)onTimer);
      std::weak_ptr<hwnet::util::Timer>::operator=
                (&this->timer,(weak_ptr<hwnet::util::Timer> *)local_58);
      std::weak_ptr<hwnet::util::Timer>::~weak_ptr((weak_ptr<hwnet::util::Timer> *)local_58);
      std::shared_ptr<hwnet::TCPSocket>::~shared_ptr
                ((shared_ptr<hwnet::TCPSocket> *)(local_58 + 0x18));
    }
  }
  else {
    bVar1 = recvListEmpty(this);
    sp_1.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
         0;
    local_c1 = 0;
    if (!bVar1) {
      std::weak_ptr<hwnet::util::Timer>::lock((weak_ptr<hwnet::util::Timer> *)local_78);
      sp_1.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
           = 1;
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
      local_c1 = bVar1 ^ 0xff;
    }
    if ((sp_1.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
         _7_1_ & 1) != 0) {
      std::shared_ptr<hwnet::util::Timer>::~shared_ptr(local_78);
    }
    if ((local_c1 & 1) != 0) {
      std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this
                ((enable_shared_from_this<hwnet::TCPSocket> *)(local_a8 + 0x18));
      local_a8._16_8_ = std::chrono::_V2::steady_clock::now();
      (this->lastRecvTime).__d.__r = local_a8._16_8_;
      Poller::
      addTimer<void(&)(std::shared_ptr<hwnet::util::Timer>const&,std::shared_ptr<hwnet::TCPSocket>),std::shared_ptr<hwnet::TCPSocket>&>
                ((Poller *)local_a8,(milliseconds)this->poller_,
                 (_func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPSocket> *)
                 (long)timoutResolution,(shared_ptr<hwnet::TCPSocket> *)onTimer);
      std::weak_ptr<hwnet::util::Timer>::operator=
                (&this->timer,(weak_ptr<hwnet::util::Timer> *)local_a8);
      std::weak_ptr<hwnet::util::Timer>::~weak_ptr((weak_ptr<hwnet::util::Timer> *)local_a8);
      std::shared_ptr<hwnet::TCPSocket>::~shared_ptr
                ((shared_ptr<hwnet::TCPSocket> *)(local_a8 + 0x18));
    }
  }
  return;
}

Assistant:

void TCPSocket::registerTimer(int tt) {
	if(tt == timerSend) {
		//send
		if(!this->ptrSendlist->empty() && !this->timer.lock()) {
			auto sp = shared_from_this();
			this->lastSendTime = std::chrono::steady_clock::now();
			this->timer = this->poller_->addTimer(timoutResolution,TCPSocket::onTimer,sp);
		}

	} else {
		//recv
		if(!this->recvListEmpty() && !this->timer.lock()) {	
			auto sp = shared_from_this();
			this->lastRecvTime = std::chrono::steady_clock::now();
			this->timer = this->poller_->addTimer(timoutResolution,TCPSocket::onTimer,sp);
		}
	}
}